

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::FixupOutPolyline(Clipper *this,OutRec *outrec)

{
  OutPt *pOVar1;
  OutPt *pOVar2;
  OutPt *pOVar3;
  OutPt *local_20;
  
  local_20 = outrec->Pts;
  pOVar3 = local_20->Prev;
  if (local_20 != pOVar3) {
    do {
      local_20 = local_20->Next;
      pOVar1 = local_20->Prev;
      if (((local_20->Pt).X == (pOVar1->Pt).X) && ((local_20->Pt).Y == (pOVar1->Pt).Y)) {
        if (local_20 == pOVar3) {
          pOVar3 = pOVar1;
        }
        pOVar2 = local_20->Next;
        pOVar1->Next = pOVar2;
        pOVar2->Prev = pOVar1;
        operator_delete(local_20,0x28);
        local_20 = pOVar1;
      }
    } while (local_20 != pOVar3);
    if (local_20 != local_20->Prev) {
      return;
    }
  }
  DisposeOutPts(&local_20);
  outrec->Pts = (OutPt *)0x0;
  return;
}

Assistant:

void Clipper::FixupOutPolyline(OutRec &outrec)
{
  OutPt *pp = outrec.Pts;
  OutPt *lastPP = pp->Prev;
  while (pp != lastPP)
  {
    pp = pp->Next;
    if (pp->Pt == pp->Prev->Pt)
    {
      if (pp == lastPP) lastPP = pp->Prev;
      OutPt *tmpPP = pp->Prev;
      tmpPP->Next = pp->Next;
      pp->Next->Prev = tmpPP;
      delete pp;
      pp = tmpPP;
    }
  }

  if (pp == pp->Prev)
  {
    DisposeOutPts(pp);
    outrec.Pts = 0;
    return;
  }
}